

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall
GlobOpt::TypeSpecializeInlineBuiltInUnary
          (GlobOpt *this,Instr **pInstr,Value **pSrc1Val,Value **pDstVal,Value *src1OriginalVal,
          bool *redoTypeSpecRef)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ValueInfo *this_00;
  int *piVar4;
  Opnd *pOVar5;
  RegOpnd *dst;
  bool local_8d;
  int32 local_8c;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_7e;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_7c;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_7a;
  bool retVal_4;
  Opnd *pOStack_78;
  Opnd *thisOpnd;
  int local_68;
  bool retVal_3;
  int iStack_64;
  bool retVal_2;
  undefined1 local_5e;
  undefined1 local_5d;
  int32 local_5c;
  bool retVal_1;
  int32 iStack_58;
  bool shouldTypeSpecToInt;
  int maxVal;
  int minVal;
  bool retVal;
  bool areAllArgsAlwaysFloat;
  BuiltinFunction local_49;
  BuiltInFlags builtInFlags;
  BuiltinFunction builtInId;
  Value **src1Val;
  Instr **instr;
  bool *redoTypeSpecRef_local;
  Value *src1OriginalVal_local;
  Value **pDstVal_local;
  Value **pSrc1Val_local;
  Instr **pInstr_local;
  GlobOpt *this_local;
  
  if (pSrc1Val == (Value **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1def,"(pSrc1Val)","pSrc1Val");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  _builtInFlags = pSrc1Val;
  bVar2 = OpCodeAttr::IsInlineBuiltIn((*pInstr)->m_opcode);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1df2,"(OpCodeAttr::IsInlineBuiltIn(instr->m_opcode))",
                       "OpCodeAttr::IsInlineBuiltIn(instr->m_opcode)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_49 = Js::JavascriptLibrary::GetBuiltInInlineCandidateId((*pInstr)->m_opcode);
  bVar2 = Js::BuiltinFunction::operator!=(&local_49,None);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1df5,"(builtInId != Js::BuiltinFunction::None)",
                       "builtInId != Js::BuiltinFunction::None");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  maxVal._3_1_ = local_49._value;
  minVal = Js::JavascriptLibrary::GetFlagsForBuiltIn(local_49);
  maxVal._2_1_ = (minVal & BIF_Args) == BIF_TypeSpecUnaryToFloat;
  if ((bool)maxVal._2_1_) {
    bVar2 = DoFloatTypeSpec(this);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1e00,"(this->DoFloatTypeSpec())","this->DoFloatTypeSpec()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    *_builtInFlags = src1OriginalVal;
    maxVal._1_1_ = TypeSpecializeFloatUnary(this,pInstr,*_builtInFlags,pDstVal,true);
    if (!(bool)maxVal._1_1_) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1e05,"(retVal)",
                         "For inline built-ins the args have to be type-specialized to float, but something failed during the process."
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    TypeSpecializeFloatDst(this,*pInstr,(Value *)0x0,*_builtInFlags,(Value *)0x0,pDstVal);
  }
  else if ((*pInstr)->m_opcode == InlineMathAbs) {
    this_00 = ::Value::GetValueInfo(*_builtInFlags);
    local_5d = ValueInfo::GetIntValMinMax(this_00,&stack0xffffffffffffffa8,&local_5c,true);
    if ((bool)local_5d) {
      bVar2 = DoAggressiveIntTypeSpec(this);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1e12,"(this->DoAggressiveIntTypeSpec())",
                           "this->DoAggressiveIntTypeSpec()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      local_5e = TypeSpecializeIntUnary
                           (this,pInstr,_builtInFlags,pDstVal,iStack_58,local_5c,src1OriginalVal,
                            redoTypeSpecRef,true);
      if (!(bool)local_5e) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1e14,"(retVal)",
                           "For inline built-ins the args have to be type-specialized (int), but something failed during the process."
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      bVar2 = IsLoopPrePass(this);
      if ((!bVar2) && (iStack_58 == -0x80000000)) {
        GenerateBailAtOperation(this,pInstr,BailOnIntMin);
      }
      iStack_64 = IntMathCommon<int>::NearestInRangeTo(iStack_58,-0x7fffffff,0x7fffffff);
      if (iStack_64 < 1) {
        iStack_64 = -iStack_64;
      }
      local_68 = IntMathCommon<int>::NearestInRangeTo(local_5c,-0x7fffffff,0x7fffffff);
      if (local_68 < 1) {
        local_68 = -local_68;
      }
      piVar4 = max<int>(&stack0xffffffffffffff9c,&local_68);
      local_5c = *piVar4;
      if (iStack_58 < 0) {
        local_8c = 0;
      }
      else {
        local_8c = iStack_58;
      }
      iStack_58 = local_8c;
      TypeSpecializeIntDst
                (this,*pInstr,(*pInstr)->m_opcode,(Value *)0x0,*_builtInFlags,(Value *)0x0,
                 BailOutInvalid,local_8c,local_5c,pDstVal,(AddSubConstantInfo *)0x0);
    }
    else {
      bVar2 = DoFloatTypeSpec(this);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1e2a,"(this->DoFloatTypeSpec())","this->DoFloatTypeSpec()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      *_builtInFlags = src1OriginalVal;
      thisOpnd._7_1_ = TypeSpecializeFloatUnary(this,pInstr,*_builtInFlags,pDstVal,true);
      if (!(bool)thisOpnd._7_1_) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1e2d,"(retVal)",
                           "For inline built-ins the args have to be type-specialized (float), but something failed during the process."
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      TypeSpecializeFloatDst(this,*pInstr,(Value *)0x0,*_builtInFlags,(Value *)0x0,pDstVal);
    }
  }
  else if ((((*pInstr)->m_opcode == InlineMathFloor) || ((*pInstr)->m_opcode == InlineMathCeil)) ||
          ((*pInstr)->m_opcode == InlineMathRound)) {
    *_builtInFlags = src1OriginalVal;
    thisOpnd._6_1_ = TypeSpecializeFloatUnary(this,pInstr,*_builtInFlags,pDstVal,true);
    if (!(bool)thisOpnd._6_1_) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1e37,"(retVal)",
                         "For inline Math.floor and Math.ceil the src has to be type-specialized to float, but something failed during the process."
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    TypeSpecializeIntDst
              (this,*pInstr,(*pInstr)->m_opcode,(Value *)0x0,*_builtInFlags,(Value *)0x0,
               BailOutInvalid,-0x80000000,0x7fffffff,pDstVal,(AddSubConstantInfo *)0x0);
  }
  else if ((*pInstr)->m_opcode == InlineArrayPop) {
    pOStack_78 = IR::Instr::GetSrc1(*pInstr);
    if (pOStack_78 == (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1e49,"(thisOpnd)","thisOpnd");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    ToVarUses(this,*pInstr,pOStack_78,false,*_builtInFlags);
    bVar2 = IsLoopPrePass(this);
    local_8d = false;
    if (!bVar2) {
      local_7a.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           IR::Opnd::GetValueType(pOStack_78);
      local_8d = ValueType::IsLikelyNativeArray((ValueType *)&local_7a.field_0);
    }
    if (local_8d != false) {
      GenerateBailAtOperation(this,pInstr,BailOutConventionalNativeArrayAccessOnly);
    }
    pOVar5 = IR::Instr::GetDst(*pInstr);
    if (pOVar5 != (Opnd *)0x0) {
      local_7c.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           IR::Opnd::GetValueType(pOStack_78);
      bVar2 = ValueType::IsLikelyNativeIntArray((ValueType *)&local_7c.field_0);
      if (bVar2) {
        TypeSpecializeIntDst
                  (this,*pInstr,(*pInstr)->m_opcode,(Value *)0x0,(Value *)0x0,(Value *)0x0,
                   BailOutInvalid,-0x80000000,0x7fffffff,pDstVal,(AddSubConstantInfo *)0x0);
      }
      else {
        local_7e.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             IR::Opnd::GetValueType(pOStack_78);
        bVar2 = ValueType::IsLikelyNativeFloatArray((ValueType *)&local_7e.field_0);
        if (bVar2) {
          TypeSpecializeFloatDst(this,*pInstr,(Value *)0x0,(Value *)0x0,(Value *)0x0,pDstVal);
        }
        else {
          pOVar5 = IR::Instr::GetDst(*pInstr);
          bVar2 = IR::Opnd::IsRegOpnd(pOVar5);
          if (bVar2) {
            pOVar5 = IR::Instr::GetDst(*pInstr);
            dst = IR::Opnd::AsRegOpnd(pOVar5);
            ToVarRegOpnd(this,dst,this->currentBlock);
          }
        }
      }
    }
  }
  else if ((*pInstr)->m_opcode == InlineMathClz) {
    bVar2 = DoAggressiveIntTypeSpec(this);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1e6d,"(this->DoAggressiveIntTypeSpec())",
                         "this->DoAggressiveIntTypeSpec()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    bVar2 = DoLossyIntTypeSpec(this);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1e6e,"(this->DoLossyIntTypeSpec())","this->DoLossyIntTypeSpec()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    bVar2 = TypeSpecializeIntUnary
                      (this,pInstr,_builtInFlags,pDstVal,-0x80000000,0x7fffffff,src1OriginalVal,
                       redoTypeSpecRef,false);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1e71,"(retVal)","For clz32, the arg has to be type-specialized to int.")
      ;
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1e75,"(0)","Unsupported built-in!");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

void
GlobOpt::TypeSpecializeInlineBuiltInUnary(IR::Instr **pInstr, Value **pSrc1Val, Value **pDstVal, Value *const src1OriginalVal, bool *redoTypeSpecRef)
{
    IR::Instr *&instr = *pInstr;

    Assert(pSrc1Val);
    Value *&src1Val = *pSrc1Val;

    Assert(OpCodeAttr::IsInlineBuiltIn(instr->m_opcode));

    Js::BuiltinFunction builtInId = Js::JavascriptLibrary::GetBuiltInInlineCandidateId(instr->m_opcode);   // From actual instr, not profile based.
    Assert(builtInId != Js::BuiltinFunction::None);

    // Consider using different bailout for float/int FromVars, so that when the arg cannot be converted to number we don't disable
    //       type spec for other parts of the big function but rather just don't inline that built-in instr.
    //       E.g. could do that if the value is not likelyInt/likelyFloat.

    Js::BuiltInFlags builtInFlags = Js::JavascriptLibrary::GetFlagsForBuiltIn(builtInId);
    bool areAllArgsAlwaysFloat = (builtInFlags & Js::BuiltInFlags::BIF_Args) == Js::BuiltInFlags::BIF_TypeSpecUnaryToFloat;
    if (areAllArgsAlwaysFloat)
    {
        // InlineMathAcos, InlineMathAsin, InlineMathAtan, InlineMathCos, InlineMathExp, InlineMathLog, InlineMathSin, InlineMathSqrt, InlineMathTan.
        Assert(this->DoFloatTypeSpec());

        // Type-spec the src.
        src1Val = src1OriginalVal;
        bool retVal = this->TypeSpecializeFloatUnary(pInstr, src1Val, pDstVal, /* skipDst = */ true);
        AssertMsg(retVal, "For inline built-ins the args have to be type-specialized to float, but something failed during the process.");

        // Type-spec the dst.
        this->TypeSpecializeFloatDst(instr, nullptr, src1Val, nullptr, pDstVal);
    }
    else if (instr->m_opcode == Js::OpCode::InlineMathAbs)
    {
        // Consider the case when the value is unknown - because of bailout in abs we may disable type spec for the whole function which is too much.
        // First, try int.
        int minVal, maxVal;
        bool shouldTypeSpecToInt = src1Val->GetValueInfo()->GetIntValMinMax(&minVal, &maxVal, /* doAggressiveIntTypeSpec = */ true);
        if (shouldTypeSpecToInt)
        {
            Assert(this->DoAggressiveIntTypeSpec());
            bool retVal = this->TypeSpecializeIntUnary(pInstr, &src1Val, pDstVal, minVal, maxVal, src1OriginalVal, redoTypeSpecRef, true);
            AssertMsg(retVal, "For inline built-ins the args have to be type-specialized (int), but something failed during the process.");

            if (!this->IsLoopPrePass())
            {
                // Create bailout for INT_MIN which does not have corresponding int value on the positive side.
                // Check int range: if we know the range is out of overflow, we do not need the bail out at all.
                if (minVal == INT32_MIN)
                {
                    GenerateBailAtOperation(&instr, IR::BailOnIntMin);
                }
            }

            // Account for ::abs(INT_MIN) == INT_MIN (which is less than 0).
            maxVal = ::max(
                ::abs(Int32Math::NearestInRangeTo(minVal, INT_MIN + 1, INT_MAX)),
                ::abs(Int32Math::NearestInRangeTo(maxVal, INT_MIN + 1, INT_MAX)));
            minVal = minVal >= 0 ? minVal : 0;
            this->TypeSpecializeIntDst(instr, instr->m_opcode, nullptr, src1Val, nullptr, IR::BailOutInvalid, minVal, maxVal, pDstVal);
        }
        else
        {
            // If we couldn't do int, do float.
            Assert(this->DoFloatTypeSpec());
            src1Val = src1OriginalVal;
            bool retVal = this->TypeSpecializeFloatUnary(pInstr, src1Val, pDstVal, true);
            AssertMsg(retVal, "For inline built-ins the args have to be type-specialized (float), but something failed during the process.");

            this->TypeSpecializeFloatDst(instr, nullptr, src1Val, nullptr, pDstVal);
        }
    }
    else if (instr->m_opcode == Js::OpCode::InlineMathFloor || instr->m_opcode == Js::OpCode::InlineMathCeil || instr->m_opcode == Js::OpCode::InlineMathRound)
    {
        // Type specialize src to float
        src1Val = src1OriginalVal;
        bool retVal = this->TypeSpecializeFloatUnary(pInstr, src1Val, pDstVal, /* skipDst = */ true);
        AssertMsg(retVal, "For inline Math.floor and Math.ceil the src has to be type-specialized to float, but something failed during the process.");

        // Type specialize dst to int
        this->TypeSpecializeIntDst(
            instr,
            instr->m_opcode,
            nullptr,
            src1Val,
            nullptr,
            IR::BailOutInvalid,
            INT32_MIN,
            INT32_MAX,
            pDstVal);
    }
    else if(instr->m_opcode == Js::OpCode::InlineArrayPop)
    {
        IR::Opnd *const thisOpnd = instr->GetSrc1();

        Assert(thisOpnd);

        // Ensure src1 (Array) is a var
        this->ToVarUses(instr, thisOpnd, false, src1Val);

        if(!this->IsLoopPrePass() && thisOpnd->GetValueType().IsLikelyNativeArray())
        {
            // We bail out, if there is illegal access or a mismatch in the Native array type that is optimized for, during the run time.
            GenerateBailAtOperation(&instr, IR::BailOutConventionalNativeArrayAccessOnly);
        }

        if(!instr->GetDst())
        {
            return;
        }

        // Try Type Specializing the element (return item from Pop) based on the array's profile data.
        if(thisOpnd->GetValueType().IsLikelyNativeIntArray())
        {
            this->TypeSpecializeIntDst(instr, instr->m_opcode, nullptr, nullptr, nullptr, IR::BailOutInvalid, INT32_MIN, INT32_MAX, pDstVal);
        }
        else if(thisOpnd->GetValueType().IsLikelyNativeFloatArray())
        {
            this->TypeSpecializeFloatDst(instr, nullptr, nullptr, nullptr, pDstVal);
        }
        else
        {
            // We reached here so the Element is not yet type specialized. Ensure element is a var
            if(instr->GetDst()->IsRegOpnd())
            {
                this->ToVarRegOpnd(instr->GetDst()->AsRegOpnd(), currentBlock);
            }
        }
    }
    else if (instr->m_opcode == Js::OpCode::InlineMathClz)
    {
        Assert(this->DoAggressiveIntTypeSpec());
        Assert(this->DoLossyIntTypeSpec());
        //Type specialize to int
        bool retVal = this->TypeSpecializeIntUnary(pInstr, &src1Val, pDstVal, INT32_MIN, INT32_MAX, src1OriginalVal, redoTypeSpecRef);
        AssertMsg(retVal, "For clz32, the arg has to be type-specialized to int.");
    }
    else
    {
        AssertMsg(FALSE, "Unsupported built-in!");
    }
}